

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

SubMesh * __thiscall Assimp::Ogre::Mesh::GetSubMesh(Mesh *this,size_t index)

{
  size_type sVar1;
  const_reference ppSVar2;
  ulong local_28;
  size_t i;
  size_t index_local;
  Mesh *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::size
                      (&this->subMeshes);
    if (sVar1 <= local_28) {
      return (SubMesh *)0x0;
    }
    ppSVar2 = std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::
              operator[](&this->subMeshes,local_28);
    if (((*ppSVar2)->super_ISubMesh).index == index) break;
    local_28 = local_28 + 1;
  }
  ppSVar2 = std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::
            operator[](&this->subMeshes,local_28);
  return *ppSVar2;
}

Assistant:

SubMesh *Mesh::GetSubMesh( size_t index ) const
{
    for ( size_t i = 0; i < subMeshes.size(); ++i ) {
        if ( subMeshes[ i ]->index == index ) {
            return subMeshes[ i ];
        }
    }
    return 0;
}